

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibs,string *flags,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkFlags,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  undefined8 __s;
  bool bVar2;
  TargetType TVar3;
  cmComputeLinkInformation *pcli_00;
  string *psVar4;
  ulong uVar5;
  cmGlobalGenerator *pcVar6;
  undefined1 local_3b8 [8];
  string extraLinkFlags;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkOpts_1;
  allocator<char> local_351;
  string local_350;
  cmValue local_330;
  cmValue targetLinkFlags_1;
  string cmp0065Flags;
  undefined1 local_2e8 [8];
  string sFlagVar;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  int local_23c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  string exeFlags;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkOpts;
  allocator<char> local_169;
  string local_168;
  cmValue local_148;
  cmValue targetLinkFlags;
  undefined1 local_138 [8];
  string build;
  string local_110;
  string local_f0;
  undefined1 local_d0 [8];
  string sharedLibFlags;
  undefined1 local_98 [8];
  string linkLanguage;
  char *libraryLinkVariable;
  cmComputeLinkInformation *pcli;
  string configUpper;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkFlags_local;
  string *flags_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkLibs_local;
  string *config_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmLocalGenerator *this_local;
  
  configUpper.field_2._8_8_ = linkFlags;
  cmsys::SystemTools::UpperCase((string *)&pcli,config);
  pcli_00 = cmGeneratorTarget::GetLinkInformation(target,config);
  linkLanguage.field_2._8_8_ = anon_var_dwarf_6bea32;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(local_98,linkLineComputer,target,config);
  TVar3 = cmGeneratorTarget::GetType(target);
  switch(TVar3) {
  case EXECUTABLE:
    std::__cxx11::string::string((string *)local_1d0);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"Swift");
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"CMAKE_EXE_LINKER_FLAGS",&local_1f1);
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_1f0);
      std::__cxx11::string::operator=((string *)local_1d0,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      std::__cxx11::string::operator+=((string *)local_1d0," ");
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar1 = this->Makefile;
        cmStrCat<char_const(&)[24],std::__cxx11::string_const&>
                  (&local_218,(char (*) [24])"CMAKE_EXE_LINKER_FLAGS_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcli);
        psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_218);
        std::__cxx11::string::operator+=((string *)local_1d0,(string *)psVar4);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::operator+=((string *)local_1d0," ");
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        bVar2 = cmGeneratorTarget::IsWin32Executable(target,config);
        if (bVar2) {
          pcVar1 = this->Makefile;
          cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
                    (&local_260,(char (*) [7])0x11240fa,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (char (*) [18])"_CREATE_WIN32_EXE");
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_260);
          std::__cxx11::string::operator+=((string *)local_1d0,(string *)psVar4);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::operator+=((string *)local_1d0," ");
        }
        else {
          pcVar1 = this->Makefile;
          cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[20]>
                    (&local_280,(char (*) [7])0x11240fa,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (char (*) [20])"_CREATE_CONSOLE_EXE");
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_280);
          std::__cxx11::string::operator+=((string *)local_1d0,(string *)psVar4);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::operator+=((string *)local_1d0," ");
        }
        bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
        if (bVar2) {
          pcVar1 = this->Makefile;
          cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[6]>
                    (&local_2a0,(char (*) [19])"CMAKE_EXE_EXPORTS_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (char (*) [6])0x1148f7a);
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_2a0);
          std::__cxx11::string::operator+=((string *)local_1d0,(string *)psVar4);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::operator+=((string *)local_1d0," ");
        }
        goto LAB_00452df6;
      }
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      std::operator+(&local_238,"CMake can not determine linker language for target: ",psVar4);
      cmSystemTools::Error(&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      local_23c = 1;
    }
    else {
LAB_00452df6:
      AddLanguageFlagsForLinking(this,flags,target,(string *)local_98,config);
      if (pcli_00 != (cmComputeLinkInformation *)0x0) {
        OutputLinkLibraries(this,pcli_00,linkLineComputer,linkLibs,frameworkPath,linkPath);
      }
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c0,"BUILD_SHARED_LIBS",
                 (allocator<char> *)(sFlagVar.field_2._M_local_buf + 0xf));
      bVar2 = cmMakefile::IsOn(pcVar1,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)(sFlagVar.field_2._M_local_buf + 0xf));
      if (bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cmp0065Flags.field_2 + 8),"CMAKE_SHARED_BUILD_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cmp0065Flags.field_2 + 8),"_FLAGS");
        std::__cxx11::string::~string((string *)(cmp0065Flags.field_2._M_local_buf + 8));
        psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_2e8);
        std::__cxx11::string::operator+=((string *)local_1d0,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_1d0," ");
        std::__cxx11::string::~string((string *)local_2e8);
      }
      GetLinkLibsCMP0065((string *)&targetLinkFlags_1,this,(string *)local_98,target);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_1d0,(string *)&targetLinkFlags_1);
        std::__cxx11::string::operator+=((string *)local_1d0," ");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"LINK_FLAGS",&local_351);
      local_330 = cmGeneratorTarget::GetProperty(target,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      bVar2 = cmValue::operator_cast_to_bool(&local_330);
      if (bVar2) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_330);
        std::__cxx11::string::operator+=((string *)local_1d0,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_1d0," ");
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        cmStrCat<char_const(&)[12],std::__cxx11::string_const&>
                  ((string *)
                   &linkOpts_1.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [12])"LINK_FLAGS_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcli);
        local_330 = cmGeneratorTarget::GetProperty
                              (target,(string *)
                                      &linkOpts_1.
                                       super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &linkOpts_1.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = cmValue::operator_cast_to_bool(&local_330);
        if (bVar2) {
          psVar4 = cmValue::operator*[abi_cxx11_(&local_330);
          std::__cxx11::string::operator+=((string *)local_1d0,(string *)psVar4);
          std::__cxx11::string::operator+=((string *)local_1d0," ");
        }
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar6 = GetGlobalGenerator(this);
        (*pcVar6->_vptr_cmGlobalGenerator[0x3c])(pcVar6,local_1d0);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   configUpper.field_2._8_8_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      }
      cmGeneratorTarget::GetLinkOptions
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&extraLinkFlags.field_2 + 8),target,config,(string *)local_98);
      pcVar6 = GetGlobalGenerator(this);
      bVar2 = cmGlobalGenerator::GetUseLinkScript(pcVar6);
      cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,bVar2);
      AppendCompileOptions
                (this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)configUpper.field_2._8_8_,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&extraLinkFlags.field_2 + 8),(char *)0x0);
      cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,false);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&extraLinkFlags.field_2 + 8));
      std::__cxx11::string::~string((string *)&targetLinkFlags_1);
      local_23c = 0;
    }
    std::__cxx11::string::~string((string *)local_1d0);
    if (local_23c != 0) goto LAB_004534b8;
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&sharedLibFlags.field_2 + 8),this,config,(string *)local_98,target);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)configUpper.field_2._8_8_,
                (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&sharedLibFlags.field_2 + 8));
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&sharedLibFlags.field_2 + 8));
    break;
  case MODULE_LIBRARY:
    linkLanguage.field_2._8_8_ = anon_var_dwarf_6bea3f;
  case SHARED_LIBRARY:
    std::__cxx11::string::string((string *)local_d0);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"Swift");
    __s = linkLanguage.field_2._8_8_;
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,(char *)__s,
                 (allocator<char> *)(build.field_2._M_local_buf + 0xf));
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_110);
      build.field_2._M_local_buf[0xe] = ' ';
      cmStrCat<std::__cxx11::string_const&,char>(&local_f0,psVar4,build.field_2._M_local_buf + 0xe);
      std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)(build.field_2._M_local_buf + 0xf));
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        targetLinkFlags.Value._7_1_ = 0x5f;
        cmStrCat<char_const*&,char,std::__cxx11::string_const&>
                  ((string *)local_138,(char **)((long)&linkLanguage.field_2 + 8),
                   (char *)((long)&targetLinkFlags.Value + 7),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcli);
        psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_138);
        std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_d0," ");
        std::__cxx11::string::~string((string *)local_138);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"LINK_FLAGS",&local_169)
    ;
    local_148 = cmGeneratorTarget::GetProperty(target,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    bVar2 = cmValue::operator_cast_to_bool(&local_148);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_148);
      std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)local_d0," ");
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmStrCat<char_const(&)[12],std::__cxx11::string_const&>
                ((string *)
                 &linkOpts.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [12])"LINK_FLAGS_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcli);
      local_148 = cmGeneratorTarget::GetProperty
                            (target,(string *)
                                    &linkOpts.
                                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &linkOpts.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = cmValue::operator_cast_to_bool(&local_148);
      if (bVar2) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_148);
        std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)local_d0," ");
      }
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar6 = GetGlobalGenerator(this);
      (*pcVar6->_vptr_cmGlobalGenerator[0x3c])(pcVar6,local_d0);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 configUpper.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
    }
    cmGeneratorTarget::GetLinkOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&exeFlags.field_2 + 8),target,config,(string *)local_98);
    pcVar6 = GetGlobalGenerator(this);
    bVar2 = cmGlobalGenerator::GetUseLinkScript(pcVar6);
    cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,bVar2);
    AppendCompileOptions
              (this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)configUpper.field_2._8_8_,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&exeFlags.field_2 + 8),(char *)0x0);
    cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,false);
    if (pcli_00 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,pcli_00,linkLineComputer,linkLibs,frameworkPath,linkPath);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&exeFlags.field_2 + 8));
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::__cxx11::string::string((string *)local_3b8);
  AppendLinkerTypeFlags(this,(string *)local_3b8,target,config,(string *)local_98);
  AppendPositionIndependentLinkerFlags(this,(string *)local_3b8,target,config,(string *)local_98);
  AppendIPOLinkerFlags(this,(string *)local_3b8,target,config,(string *)local_98);
  AppendDependencyInfoLinkerFlags(this,(string *)local_3b8,target,config,(string *)local_98);
  AppendModuleDefinitionFlag(this,(string *)local_3b8,target,linkLineComputer,config);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar6 = GetGlobalGenerator(this);
    (*pcVar6->_vptr_cmGlobalGenerator[0x3c])(pcVar6,local_3b8);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               configUpper.field_2._8_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8);
  }
  std::__cxx11::string::~string((string *)local_3b8);
  local_23c = 0;
LAB_004534b8:
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&pcli);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::vector<BT<std::string>>& linkLibs, std::string& flags,
  std::vector<BT<std::string>>& linkFlags, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath, cmGeneratorTarget* target)
{
  const std::string configUpper = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, config);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      linkFlags = this->GetStaticLibraryFlags(config, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      std::string sharedLibFlags;
      if (linkLanguage != "Swift") {
        sharedLibFlags = cmStrCat(
          this->Makefile->GetSafeDefinition(libraryLinkVariable), ' ');
        if (!configUpper.empty()) {
          std::string build = cmStrCat(libraryLinkVariable, '_', configUpper);
          sharedLibFlags += this->Makefile->GetSafeDefinition(build);
          sharedLibFlags += " ";
        }
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        sharedLibFlags += *targetLinkFlags;
        sharedLibFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          sharedLibFlags += *targetLinkFlags;
          sharedLibFlags += " ";
        }
      }

      if (!sharedLibFlags.empty()) {
        this->GetGlobalGenerator()->EncodeLiteral(sharedLibFlags);
        linkFlags.emplace_back(std::move(sharedLibFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      this->SetLinkScriptShell(this->GetGlobalGenerator()->GetUseLinkScript());
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      this->SetLinkScriptShell(false);

      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      std::string exeFlags;
      if (linkLanguage != "Swift") {
        exeFlags = this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        exeFlags += " ";
        if (!configUpper.empty()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_LINKER_FLAGS_", configUpper));
          exeFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->IsWin32Executable(config)) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_WIN32_EXE"));
          exeFlags += " ";
        } else {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_CONSOLE_EXE"));
          exeFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_EXPORTS_", linkLanguage, "_FLAG"));
          exeFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, config);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (this->Makefile->IsOn("BUILD_SHARED_LIBS")) {
        std::string sFlagVar = "CMAKE_SHARED_BUILD_" + linkLanguage + "_FLAGS";
        exeFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        exeFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        exeFlags += cmp0065Flags;
        exeFlags += " ";
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        exeFlags += *targetLinkFlags;
        exeFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          exeFlags += *targetLinkFlags;
          exeFlags += " ";
        }
      }

      if (!exeFlags.empty()) {
        this->GetGlobalGenerator()->EncodeLiteral(exeFlags);
        linkFlags.emplace_back(std::move(exeFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      this->SetLinkScriptShell(this->GetGlobalGenerator()->GetUseLinkScript());
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      this->SetLinkScriptShell(false);
    } break;
    default:
      break;
  }

  std::string extraLinkFlags;
  this->AppendLinkerTypeFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendPositionIndependentLinkerFlags(extraLinkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendDependencyInfoLinkerFlags(extraLinkFlags, target, config,
                                        linkLanguage);
  this->AppendModuleDefinitionFlag(extraLinkFlags, target, linkLineComputer,
                                   config);

  if (!extraLinkFlags.empty()) {
    this->GetGlobalGenerator()->EncodeLiteral(extraLinkFlags);
    linkFlags.emplace_back(std::move(extraLinkFlags));
  }
}